

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFFLoader.cpp
# Opt level: O2

void __thiscall
Assimp::NFFImporter::LoadNFF2MaterialTable
          (NFFImporter *this,
          vector<Assimp::NFFImporter::ShadingInfo,_std::allocator<Assimp::NFFImporter::ShadingInfo>_>
          *output,string *path,IOSystem *pIOHandler)

{
  vector<Assimp::NFFImporter::ShadingInfo,_std::allocator<Assimp::NFFImporter::ShadingInfo>_>
  *pvVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  Logger *pLVar5;
  char *sz;
  allocator local_1241;
  pointer local_1240;
  IOStream *local_1238;
  char *buffer;
  vector<Assimp::NFFImporter::ShadingInfo,_std::allocator<Assimp::NFFImporter::ShadingInfo>_>
  *local_1228;
  float *local_1220;
  float *local_1218;
  char *local_1210 [4];
  vector<char,_std::allocator<char>_> mBuffer2;
  undefined1 local_11d8 [8];
  ulong uStack_11d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_11c8;
  ai_real local_11b8;
  undefined1 local_11b4 [16];
  undefined8 local_11a4;
  float local_119c;
  _Alloc_hider local_1198;
  size_type local_1190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1188;
  undefined2 local_1178;
  undefined8 local_1174;
  _Alloc_hider local_1168;
  size_type local_1160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1158;
  aiTextureMapping local_1148;
  string local_1058 [32];
  char line [4096];
  IOStream *pIVar4;
  
  std::__cxx11::string::string((string *)line,"rb",(allocator *)local_11d8);
  iVar3 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(path->_M_dataplus)._M_p,line._0_8_);
  pIVar4 = (IOStream *)CONCAT44(extraout_var,iVar3);
  std::__cxx11::string::~string((string *)line);
  if (pIVar4 == (IOStream *)0x0) {
    pLVar5 = DefaultLogger::get();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_11d8,
                   "NFF2: Unable to open material library ",path);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)line,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_11d8,
                   ".");
    Logger::error(pLVar5,(char *)line._0_8_);
    std::__cxx11::string::~string((string *)line);
    std::__cxx11::string::~string((string *)local_11d8);
  }
  else {
    local_1238 = pIVar4;
    iVar3 = (*pIVar4->_vptr_IOStream[6])(pIVar4);
    std::vector<char,_std::allocator<char>_>::vector
              (&mBuffer2,(ulong)(iVar3 + 1),(allocator_type *)line);
    BaseImporter::TextFileToBuffer(local_1238,&mBuffer2,FORBID_EMPTY);
    buffer = mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    CommentRemover::RemoveLineComments
              ("//",mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,' ');
    bVar2 = TokenMatch<char_const>(&buffer,"mat",3);
    if (bVar2) {
      local_1228 = output;
LAB_00427ba4:
      local_1240 = (pointer)0x0;
      do {
        local_1220 = &local_1240->opacity;
        local_1218 = &local_1240->shininess;
        while( true ) {
          while( true ) {
            bVar2 = GetNextLine<char>(&buffer,line);
            if (!bVar2) goto LAB_004283f7;
            SkipSpaces<char>(line,&sz);
            bVar2 = TokenMatch<char_const>(&sz,"version",7);
            if (!bVar2) break;
            pLVar5 = DefaultLogger::get();
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[44]>
                      ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_11d8,(char (*) [44])"NFF (Sense8) material library file format: ");
            std::__cxx11::string::string(local_1058,sz,&local_1241);
            std::operator<<((ostream *)local_11d8,local_1058);
            std::__cxx11::stringbuf::str();
            Logger::info(pLVar5,local_1210[0]);
            std::__cxx11::string::~string((string *)local_1210);
            std::__cxx11::string::~string(local_1058);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_11d8);
          }
          bVar2 = TokenMatch<char_const>(&sz,"matdef",6);
          pvVar1 = local_1228;
          if (bVar2) break;
          bVar2 = TokenMatch<char_const>(&sz,"valid",5);
          if ((!bVar2) && ((0xd < (byte)*sz || ((0x3401U >> ((byte)*sz & 0x1f) & 1) == 0)))) {
            if (local_1240 == (pointer)0x0) {
              pLVar5 = DefaultLogger::get();
              Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
              basic_formatter<char[38]>
                        ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_11d8,(char (*) [38])"NFF2 material library: Found element ");
              std::operator<<((ostream *)local_11d8,sz);
              std::operator<<((ostream *)local_11d8,"but there is no active material");
              std::__cxx11::stringbuf::str();
              Logger::error(pLVar5,local_1210[0]);
              std::__cxx11::string::~string((string *)local_1210);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_11d8);
              goto LAB_00427ba4;
            }
            local_11d8 = (undefined1  [8])0x0;
            uStack_11d0 = uStack_11d0 & 0xffffffff00000000;
            bVar2 = TokenMatch<char_const>(&sz,"ambient",7);
            if (bVar2) {
              SkipSpaces<char>(&sz);
              if ((0xd < (byte)*sz) || ((0x3401U >> ((byte)*sz & 0x1f) & 1) == 0)) {
                sz = fast_atoreal_move<float>(sz,(float *)local_11d8,true);
              }
              SkipSpaces<char>(&sz);
              if ((0xd < (byte)*sz) || ((0x3401U >> ((byte)*sz & 0x1f) & 1) == 0)) {
                sz = fast_atoreal_move<float>(sz,(float *)(local_11d8 + 4),true);
              }
              SkipSpaces<char>(&sz);
              if ((0xd < (byte)*sz) || ((0x3401U >> ((byte)*sz & 0x1f) & 1) == 0)) {
                sz = fast_atoreal_move<float>(sz,(float *)&uStack_11d0,true);
              }
              (local_1240->ambient).r = (ai_real)local_11d8._0_4_;
              (local_1240->ambient).g = (ai_real)local_11d8._4_4_;
              (local_1240->ambient).b = (ai_real)uStack_11d0;
            }
            else {
              bVar2 = TokenMatch<char_const>(&sz,"diffuse",7);
              if ((bVar2) || (bVar2 = TokenMatch<char_const>(&sz,"ambientdiffuse",0xe), bVar2)) {
                SkipSpaces<char>(&sz);
                if ((0xd < (byte)*sz) || ((0x3401U >> ((byte)*sz & 0x1f) & 1) == 0)) {
                  sz = fast_atoreal_move<float>(sz,(float *)local_11d8,true);
                }
                SkipSpaces<char>(&sz);
                if ((0xd < (byte)*sz) || ((0x3401U >> ((byte)*sz & 0x1f) & 1) == 0)) {
                  sz = fast_atoreal_move<float>(sz,(float *)(local_11d8 + 4),true);
                }
                SkipSpaces<char>(&sz);
                if ((0xd < (byte)*sz) || ((0x3401U >> ((byte)*sz & 0x1f) & 1) == 0)) {
                  sz = fast_atoreal_move<float>(sz,(float *)&uStack_11d0,true);
                }
                (local_1240->ambient).b = (ai_real)uStack_11d0;
                (local_1240->ambient).r = (ai_real)local_11d8._0_4_;
                (local_1240->ambient).g = (ai_real)local_11d8._4_4_;
                (local_1240->diffuse).r = (ai_real)local_11d8._0_4_;
                (local_1240->diffuse).g = (ai_real)local_11d8._4_4_;
                (local_1240->diffuse).b = (ai_real)uStack_11d0;
              }
              else {
                bVar2 = TokenMatch<char_const>(&sz,"specular",8);
                if (bVar2) {
                  SkipSpaces<char>(&sz);
                  if ((0xd < (byte)*sz) || ((0x3401U >> ((byte)*sz & 0x1f) & 1) == 0)) {
                    sz = fast_atoreal_move<float>(sz,(float *)local_11d8,true);
                  }
                  SkipSpaces<char>(&sz);
                  if ((0xd < (byte)*sz) || ((0x3401U >> ((byte)*sz & 0x1f) & 1) == 0)) {
                    sz = fast_atoreal_move<float>(sz,(float *)(local_11d8 + 4),true);
                  }
                  SkipSpaces<char>(&sz);
                  if ((0xd < (byte)*sz) || ((0x3401U >> ((byte)*sz & 0x1f) & 1) == 0)) {
                    sz = fast_atoreal_move<float>(sz,(float *)&uStack_11d0,true);
                  }
                  (local_1240->specular).r = (ai_real)local_11d8._0_4_;
                  (local_1240->specular).g = (ai_real)local_11d8._4_4_;
                  (local_1240->specular).b = (ai_real)uStack_11d0;
                }
                else {
                  bVar2 = TokenMatch<char_const>(&sz,"emission",8);
                  if (bVar2) {
                    SkipSpaces<char>(&sz);
                    if ((0xd < (byte)*sz) || ((0x3401U >> ((byte)*sz & 0x1f) & 1) == 0)) {
                      sz = fast_atoreal_move<float>(sz,(float *)local_11d8,true);
                    }
                    SkipSpaces<char>(&sz);
                    if ((0xd < (byte)*sz) || ((0x3401U >> ((byte)*sz & 0x1f) & 1) == 0)) {
                      sz = fast_atoreal_move<float>(sz,(float *)(local_11d8 + 4),true);
                    }
                    SkipSpaces<char>(&sz);
                    if ((0xd < (byte)*sz) || ((0x3401U >> ((byte)*sz & 0x1f) & 1) == 0)) {
                      sz = fast_atoreal_move<float>(sz,(float *)&uStack_11d0,true);
                    }
                    (local_1240->emissive).r = (ai_real)local_11d8._0_4_;
                    (local_1240->emissive).g = (ai_real)local_11d8._4_4_;
                    (local_1240->emissive).b = (ai_real)uStack_11d0;
                  }
                  else {
                    bVar2 = TokenMatch<char_const>(&sz,"shininess",9);
                    if (bVar2) {
                      SkipSpaces<char>(&sz);
                      if ((0xd < (byte)*sz) || ((0x3401U >> ((byte)*sz & 0x1f) & 1) == 0)) {
                        sz = fast_atoreal_move<float>(sz,local_1218,true);
                      }
                    }
                    else {
                      bVar2 = TokenMatch<char_const>(&sz,"opacity",7);
                      if (bVar2) {
                        SkipSpaces<char>(&sz);
                        if ((0xd < (byte)*sz) || ((0x3401U >> ((byte)*sz & 0x1f) & 1) == 0)) {
                          sz = fast_atoreal_move<float>(sz,local_1220,true);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        local_11d8 = (undefined1  [8])0x3f19999a3f19999a;
        uStack_11d0 = 0x3f8000003f19999a;
        local_11c8._M_allocated_capacity = 0x3f8000003f800000;
        local_11c8._8_4_ = 1.0;
        local_11c8._12_4_ = 1.0;
        local_11b8 = 1.0;
        local_11b4._0_4_ = 0.0;
        local_11b4._4_4_ = 0.0;
        local_11b4._8_8_ = 0;
        local_11a4._0_4_ = 0.0;
        local_11a4._4_4_ = 0.0;
        local_119c = 1.0;
        local_1198._M_p = (pointer)&local_1188;
        local_1190 = 0;
        local_1188._M_local_buf[0] = '\0';
        local_1178 = 0x100;
        local_1174 = 0x3f800000;
        local_1168._M_p = (pointer)&local_1158;
        local_1160 = 0;
        local_1158._M_local_buf[0] = '\0';
        local_1148 = aiTextureMapping_UV;
        std::
        vector<Assimp::NFFImporter::ShadingInfo,_std::allocator<Assimp::NFFImporter::ShadingInfo>_>
        ::emplace_back<Assimp::NFFImporter::ShadingInfo>(local_1228,(ShadingInfo *)local_11d8);
        ShadingInfo::~ShadingInfo((ShadingInfo *)local_11d8);
        local_1240 = (pvVar1->
                     super__Vector_base<Assimp::NFFImporter::ShadingInfo,_std::allocator<Assimp::NFFImporter::ShadingInfo>_>
                     )._M_impl.super__Vector_impl_data._M_finish + -1;
      } while( true );
    }
    pLVar5 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[36]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)line,
               (char (*) [36])"NFF2: Not a valid material library ");
    std::operator<<((ostream *)line,(string *)path);
    std::operator<<((ostream *)line,".");
    std::__cxx11::stringbuf::str();
    Logger::error(pLVar5,(char *)local_11d8);
    std::__cxx11::string::~string((string *)local_11d8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)line);
LAB_004283f7:
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&mBuffer2.super__Vector_base<char,_std::allocator<char>_>);
    (*local_1238->_vptr_IOStream[1])();
  }
  return;
}

Assistant:

void NFFImporter::LoadNFF2MaterialTable(std::vector<ShadingInfo>& output,
    const std::string& path, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( path, "rb"));

    // Check whether we can read from the file
    if( !file.get())    {
        ASSIMP_LOG_ERROR("NFF2: Unable to open material library " + path + ".");
        return;
    }

    // get the size of the file
    const unsigned int m = (unsigned int)file->FileSize();

    // allocate storage and copy the contents of the file to a memory buffer
    // (terminate it with zero)
    std::vector<char> mBuffer2(m+1);
    TextFileToBuffer(file.get(),mBuffer2);
    const char* buffer = &mBuffer2[0];

    // First of all: remove all comments from the file
    CommentRemover::RemoveLineComments("//",&mBuffer2[0]);

    // The file should start with the magic sequence "mat"
    if (!TokenMatch(buffer,"mat",3))    {
        ASSIMP_LOG_ERROR_F("NFF2: Not a valid material library ", path, ".");
        return;
    }

    ShadingInfo* curShader = NULL;

    // No read the file line per line
    char line[4096];
    const char* sz;
    while (GetNextLine(buffer,line))
    {
        SkipSpaces(line,&sz);

        // 'version' defines the version of the file format
        if (TokenMatch(sz,"version",7))
        {
            ASSIMP_LOG_INFO_F("NFF (Sense8) material library file format: ", std::string(sz));
        }
        // 'matdef' starts a new material in the file
        else if (TokenMatch(sz,"matdef",6))
        {
            // add a new material to the list
            output.push_back( ShadingInfo() );
            curShader = & output.back();

            // parse the name of the material
        }
        else if (!TokenMatch(sz,"valid",5))
        {
            // check whether we have an active material at the moment
            if (!IsLineEnd(*sz))
            {
                if (!curShader)
                {
                    ASSIMP_LOG_ERROR_F("NFF2 material library: Found element ", sz, "but there is no active material");
                    continue;
                }
            }
            else continue;

            // now read the material property and determine its type
            aiColor3D c;
            if (TokenMatch(sz,"ambient",7))
            {
                AI_NFF_PARSE_TRIPLE(c);
                curShader->ambient = c;
            }
            else if (TokenMatch(sz,"diffuse",7) || TokenMatch(sz,"ambientdiffuse",14) /* correct? */)
            {
                AI_NFF_PARSE_TRIPLE(c);
                curShader->diffuse = curShader->ambient = c;
            }
            else if (TokenMatch(sz,"specular",8))
            {
                AI_NFF_PARSE_TRIPLE(c);
                curShader->specular = c;
            }
            else if (TokenMatch(sz,"emission",8))
            {
                AI_NFF_PARSE_TRIPLE(c);
                curShader->emissive = c;
            }
            else if (TokenMatch(sz,"shininess",9))
            {
                AI_NFF_PARSE_FLOAT(curShader->shininess);
            }
            else if (TokenMatch(sz,"opacity",7))
            {
                AI_NFF_PARSE_FLOAT(curShader->opacity);
            }
        }
    }
}